

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall
ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate
          (Array<ConvexDecomposition::Plane> *this,int s)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Plane *__ptr;
  undefined8 uVar3;
  Plane *pPVar4;
  long lVar5;
  long lVar6;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  if (s < this->count) {
    __assert_fail("s>=count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c0,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  __ptr = this->element;
  this->array_size = s;
  pPVar4 = (Plane *)malloc((ulong)(uint)s << 4);
  this->element = pPVar4;
  if (pPVar4 == (Plane *)0x0) {
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,
                  "void ConvexDecomposition::Array<ConvexDecomposition::Plane>::allocate(int) [Type = ConvexDecomposition::Plane]"
                 );
  }
  if (0 < this->count) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(__ptr->normal).x + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(this->element->normal).x + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < this->count);
  }
  if (__ptr != (Plane *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}